

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSubSimplexConvexCast.cpp
# Opt level: O1

bool __thiscall
cbtSubsimplexConvexCast::calcTimeOfImpact
          (cbtSubsimplexConvexCast *this,cbtTransform *fromA,cbtTransform *toA,cbtTransform *fromB,
          cbtTransform *toB,CastResult *result)

{
  cbtVector3 cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined1 auVar5 [16];
  float fVar6;
  cbtScalar acVar7 [4];
  undefined1 auVar8 [16];
  cbtScalar s;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  cbtVector3 hitA;
  cbtVector3 hitB;
  float local_14c;
  cbtVector3 local_148;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  float local_110;
  cbtScalar local_10c;
  cbtScalar local_108;
  cbtScalar local_104;
  cbtScalar local_100;
  cbtScalar local_fc;
  cbtScalar local_f8;
  cbtScalar local_f4;
  cbtScalar local_f0;
  cbtScalar local_ec;
  cbtScalar local_e8;
  cbtScalar local_e4;
  cbtScalar local_e0;
  cbtScalar local_dc;
  cbtScalar local_d8;
  float local_d4;
  cbtScalar local_d0;
  cbtScalar local_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  cbtVector3 local_a8;
  cbtVector3 local_98;
  cbtVector3 local_88;
  undefined1 local_78 [16];
  cbtTransform *local_60;
  cbtTransform *local_58;
  cbtVector3 local_50;
  cbtVector3 local_40;
  
  cbtVoronoiSimplexSolver::reset(this->m_simplexSolver);
  local_114 = (fromA->m_origin).m_floats[0];
  local_118 = (fromA->m_origin).m_floats[1];
  local_11c = (fromA->m_origin).m_floats[2];
  local_120 = (fromB->m_origin).m_floats[0];
  local_12c = ((toA->m_origin).m_floats[0] - local_114) - ((toB->m_origin).m_floats[0] - local_120);
  local_124 = (fromB->m_origin).m_floats[1];
  local_134 = ((toA->m_origin).m_floats[1] - local_118) - ((toB->m_origin).m_floats[1] - local_124);
  local_128 = (fromB->m_origin).m_floats[2];
  local_130 = ((toA->m_origin).m_floats[2] - local_11c) - ((toB->m_origin).m_floats[2] - local_128);
  local_78._0_4_ = (fromA->m_basis).m_el[0].m_floats[0];
  local_cc = (fromA->m_basis).m_el[0].m_floats[1];
  local_d0 = (fromA->m_basis).m_el[0].m_floats[2];
  local_d4 = (fromA->m_basis).m_el[1].m_floats[0];
  local_d8 = (fromA->m_basis).m_el[1].m_floats[1];
  local_dc = (fromA->m_basis).m_el[1].m_floats[2];
  local_e0 = (fromA->m_basis).m_el[2].m_floats[0];
  local_e4 = (fromA->m_basis).m_el[2].m_floats[1];
  local_e8 = (fromA->m_basis).m_el[2].m_floats[2];
  local_ec = (fromB->m_basis).m_el[0].m_floats[0];
  local_f0 = (fromB->m_basis).m_el[0].m_floats[1];
  local_f4 = (fromB->m_basis).m_el[0].m_floats[2];
  local_f8 = (fromB->m_basis).m_el[1].m_floats[0];
  local_fc = (fromB->m_basis).m_el[1].m_floats[1];
  local_100 = (fromB->m_basis).m_el[1].m_floats[2];
  local_104 = (fromB->m_basis).m_el[2].m_floats[0];
  local_108 = (fromB->m_basis).m_el[2].m_floats[1];
  local_10c = (fromB->m_basis).m_el[2].m_floats[2];
  auVar10 = ZEXT416((uint)local_12c);
  auVar8 = vfnmsub231ss_fma(ZEXT416((uint)(local_134 * local_d4)),ZEXT416((uint)local_78._0_4_),
                            auVar10);
  auVar11 = ZEXT416((uint)local_130);
  auVar8 = vfnmadd231ss_fma(auVar8,ZEXT416((uint)local_e0),auVar11);
  auVar5 = vfnmsub231ss_fma(ZEXT416((uint)(local_134 * (fromA->m_basis).m_el[1].m_floats[1])),
                            ZEXT416((uint)local_cc),auVar10);
  auVar5 = vfnmadd231ss_fma(auVar5,auVar11,ZEXT416((uint)(fromA->m_basis).m_el[2].m_floats[1]));
  auVar8 = vinsertps_avx(auVar8,auVar5,0x10);
  auVar5 = vfnmsub231ss_fma(ZEXT416((uint)(local_134 * (fromA->m_basis).m_el[1].m_floats[2])),
                            ZEXT416((uint)local_d0),auVar10);
  auVar11 = vfnmadd231ss_fma(auVar5,auVar11,ZEXT416((uint)(fromA->m_basis).m_el[2].m_floats[2]));
  acVar7 = (cbtScalar  [4])vinsertps_avx(auVar8,auVar11,0x28);
  local_148.m_floats = acVar7;
  local_60 = toA;
  local_58 = toB;
  (*(this->m_convexA->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])
            (this->m_convexA,&local_148);
  auVar8 = vmovshdup_avx((undefined1  [16])acVar7);
  fVar6 = auVar8._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (fromA->m_basis).m_el[0].m_floats[1])),
                           (undefined1  [16])acVar7,
                           ZEXT416((uint)(fromA->m_basis).m_el[0].m_floats[0]));
  auVar8 = vfmadd231ss_fma(auVar8,auVar11,ZEXT416((uint)(fromA->m_basis).m_el[0].m_floats[2]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (fromA->m_basis).m_el[1].m_floats[1])),
                           (undefined1  [16])acVar7,
                           ZEXT416((uint)(fromA->m_basis).m_el[1].m_floats[0]));
  auVar5 = vfmadd231ss_fma(auVar5,auVar11,ZEXT416((uint)(fromA->m_basis).m_el[1].m_floats[2]));
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (fromA->m_basis).m_el[2].m_floats[1])),
                            (undefined1  [16])acVar7,
                            ZEXT416((uint)(fromA->m_basis).m_el[2].m_floats[0]));
  auVar10 = vfmadd231ss_fma(auVar10,auVar11,ZEXT416((uint)(fromA->m_basis).m_el[2].m_floats[2]));
  auVar8 = vinsertps_avx(ZEXT416((uint)(auVar8._0_4_ + (fromA->m_origin).m_floats[0])),
                         ZEXT416((uint)(auVar5._0_4_ + (fromA->m_origin).m_floats[1])),0x10);
  local_88.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar8,ZEXT416((uint)(auVar10._0_4_ + (fromA->m_origin).m_floats[2])),0x28);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_134 * (fromB->m_basis).m_el[1].m_floats[0])),
                           ZEXT416((uint)local_12c),
                           ZEXT416((uint)(fromB->m_basis).m_el[0].m_floats[0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_130),
                           ZEXT416((uint)(fromB->m_basis).m_el[2].m_floats[0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(local_134 * (fromB->m_basis).m_el[1].m_floats[1])),
                           ZEXT416((uint)local_12c),
                           ZEXT416((uint)(fromB->m_basis).m_el[0].m_floats[1]));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)local_130),
                           ZEXT416((uint)(fromB->m_basis).m_el[2].m_floats[1]));
  auVar8 = vinsertps_avx(auVar8,auVar5,0x10);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(local_134 * (fromB->m_basis).m_el[1].m_floats[2])),
                           ZEXT416((uint)local_12c),
                           ZEXT416((uint)(fromB->m_basis).m_el[0].m_floats[2]));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)local_130),
                           ZEXT416((uint)(fromB->m_basis).m_el[2].m_floats[2]));
  acVar7 = (cbtScalar  [4])vinsertps_avx(auVar8,auVar5,0x28);
  local_148.m_floats = acVar7;
  (*(this->m_convexB->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])
            (this->m_convexB,&local_148);
  auVar8 = vmovshdup_avx((undefined1  [16])acVar7);
  fVar6 = auVar8._0_4_;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (fromB->m_basis).m_el[0].m_floats[1])),
                           (undefined1  [16])acVar7,
                           ZEXT416((uint)(fromB->m_basis).m_el[0].m_floats[0]));
  auVar8 = vfmadd231ss_fma(auVar8,auVar5,ZEXT416((uint)(fromB->m_basis).m_el[0].m_floats[2]));
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (fromB->m_basis).m_el[1].m_floats[1])),
                            (undefined1  [16])acVar7,
                            ZEXT416((uint)(fromB->m_basis).m_el[1].m_floats[0]));
  auVar10 = vfmadd231ss_fma(auVar10,auVar5,ZEXT416((uint)(fromB->m_basis).m_el[1].m_floats[2]));
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * (fromB->m_basis).m_el[2].m_floats[1])),
                            (undefined1  [16])acVar7,
                            ZEXT416((uint)(fromB->m_basis).m_el[2].m_floats[0]));
  auVar5 = vfmadd231ss_fma(auVar11,auVar5,ZEXT416((uint)(fromB->m_basis).m_el[2].m_floats[2]));
  auVar8 = vinsertps_avx(ZEXT416((uint)(auVar8._0_4_ + (fromB->m_origin).m_floats[0])),
                         ZEXT416((uint)(auVar10._0_4_ + (fromB->m_origin).m_floats[1])),0x10);
  local_98.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar8,ZEXT416((uint)(auVar5._0_4_ + (fromB->m_origin).m_floats[2])),0x28);
  auVar8 = vinsertps_avx(ZEXT416((uint)(local_88.m_floats[0] - local_98.m_floats[0])),
                         ZEXT416((uint)(local_88.m_floats[1] - local_98.m_floats[1])),0x10);
  local_148.m_floats =
       (cbtScalar  [4])
       vinsertps_avx(auVar8,ZEXT416((uint)(local_88.m_floats[2] - local_98.m_floats[2])),0x28);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_148.m_floats[1] * local_148.m_floats[1])),
                           ZEXT416((uint)local_148.m_floats[0]),ZEXT416((uint)local_148.m_floats[0])
                          );
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_148.m_floats[2]),ZEXT416((uint)local_148.m_floats[2])
                           ,auVar8);
  auVar9 = ZEXT1664(auVar8);
  iVar4 = result->m_subSimplexCastMaxIterations + 1;
  local_c8 = ZEXT816(0) << 0x20;
  local_b8 = ZEXT816(0) << 0x20;
  local_14c = 0.0;
  do {
    if ((auVar9._0_4_ <= result->m_subSimplexCastEpsilon) || (iVar4 = iVar4 + -1, iVar4 == 0)) {
      result->m_fraction = local_14c;
      auVar8._0_4_ = local_c8._0_4_ * local_c8._0_4_;
      auVar8._4_4_ = local_c8._4_4_ * local_c8._4_4_;
      auVar8._8_4_ = local_c8._8_4_ * local_c8._8_4_;
      auVar8._12_4_ = local_c8._12_4_ * local_c8._12_4_;
      auVar8 = vmovshdup_avx(auVar8);
      auVar8 = vfmadd231ss_fma(auVar8,local_c8,local_c8);
      auVar8 = vfmadd231ss_fma(auVar8,local_b8,local_b8);
      if (1.4210855e-14 <= auVar8._0_4_) {
        auVar8 = vmovshdup_avx(local_c8);
        auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar8._0_4_)),local_c8,local_c8);
        auVar5 = vfmadd231ss_fma(auVar5,local_b8,local_b8);
        if (auVar5._0_4_ < 0.0) {
          local_78 = auVar8;
          fVar6 = sqrtf(auVar5._0_4_);
          auVar8 = local_78;
        }
        else {
          auVar5 = vsqrtss_avx(auVar5,auVar5);
          fVar6 = auVar5._0_4_;
        }
        fVar6 = 1.0 / fVar6;
        auVar5 = vinsertps_avx(ZEXT416((uint)(local_c8._0_4_ * fVar6)),
                               ZEXT416((uint)(auVar8._0_4_ * fVar6)),0x10);
        auVar8 = vblendps_avx(ZEXT416((uint)(local_b8._0_4_ * fVar6)),local_b8,2);
        auVar8 = vmovlhps_avx(auVar5,auVar8);
        *(undefined1 (*) [16])(result->m_normal).m_floats = auVar8;
      }
      else {
        *(undefined1 (*) [16])(result->m_normal).m_floats = ZEXT816(0) << 0x20;
      }
      auVar8 = vfmadd132ss_fma(ZEXT416((uint)local_12c),
                               ZEXT416((uint)(local_134 * (result->m_normal).m_floats[1])),
                               ZEXT416((uint)(result->m_normal).m_floats[0]));
      auVar8 = vfmadd132ss_fma(ZEXT416((uint)local_130),auVar8,
                               ZEXT416((uint)(result->m_normal).m_floats[2]));
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      auVar5 = vxorps_avx512vl(ZEXT416((uint)result->m_allowedPenetration),auVar5);
      if (auVar5._0_4_ <= auVar8._0_4_) {
        return false;
      }
      cbtVoronoiSimplexSolver::compute_points(this->m_simplexSolver,&local_50,&local_40);
      *(undefined8 *)(result->m_hitPoint).m_floats = local_40.m_floats._0_8_;
      *(undefined8 *)((result->m_hitPoint).m_floats + 2) = local_40.m_floats._8_8_;
      return true;
    }
    auVar8 = vfnmsub231ss_fma(ZEXT416((uint)(local_148.m_floats[1] * local_d4)),
                              ZEXT416((uint)local_148.m_floats[0]),ZEXT416((uint)local_78._0_4_));
    auVar8 = vfnmadd231ss_fma(auVar8,ZEXT416((uint)local_148.m_floats[2]),ZEXT416((uint)local_e0));
    auVar5 = vfnmsub231ss_fma(ZEXT416((uint)(local_148.m_floats[1] * local_d8)),
                              ZEXT416((uint)local_148.m_floats[0]),ZEXT416((uint)local_cc));
    auVar5 = vfnmadd231ss_fma(auVar5,ZEXT416((uint)local_148.m_floats[2]),ZEXT416((uint)local_e4));
    auVar8 = vinsertps_avx(auVar8,auVar5,0x10);
    auVar5 = vfnmsub231ss_fma(ZEXT416((uint)(local_148.m_floats[1] * local_dc)),
                              ZEXT416((uint)local_148.m_floats[0]),ZEXT416((uint)local_d0));
    auVar11 = vfnmadd231ss_fma(auVar5,ZEXT416((uint)local_148.m_floats[2]),ZEXT416((uint)local_e8));
    acVar7 = (cbtScalar  [4])vinsertps_avx(auVar8,auVar11,0x28);
    local_110 = auVar9._0_4_;
    local_50.m_floats = acVar7;
    (*(this->m_convexA->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])
              (this->m_convexA,&local_50);
    auVar8 = vmovshdup_avx((undefined1  [16])acVar7);
    fVar6 = auVar8._0_4_;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * local_cc)),(undefined1  [16])acVar7,
                             ZEXT416((uint)local_78._0_4_));
    auVar8 = vfmadd231ss_fma(auVar8,auVar11,ZEXT416((uint)local_d0));
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * local_d8)),(undefined1  [16])acVar7,
                             ZEXT416((uint)local_d4));
    auVar5 = vfmadd231ss_fma(auVar5,auVar11,ZEXT416((uint)local_dc));
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * local_e4)),(undefined1  [16])acVar7,
                              ZEXT416((uint)local_e0));
    auVar10 = vfmadd231ss_fma(auVar10,auVar11,ZEXT416((uint)local_e8));
    auVar8 = vinsertps_avx(ZEXT416((uint)(auVar8._0_4_ + local_114)),
                           ZEXT416((uint)(auVar5._0_4_ + local_118)),0x10);
    local_88.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar8,ZEXT416((uint)(auVar10._0_4_ + local_11c)),0x28);
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_148.m_floats[1] * local_f8)),
                             ZEXT416((uint)local_148.m_floats[0]),ZEXT416((uint)local_ec));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_148.m_floats[2]),ZEXT416((uint)local_104));
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(local_148.m_floats[1] * local_fc)),
                             ZEXT416((uint)local_148.m_floats[0]),ZEXT416((uint)local_f0));
    auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)local_148.m_floats[2]),ZEXT416((uint)local_108));
    auVar8 = vinsertps_avx(auVar8,auVar5,0x10);
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(local_148.m_floats[1] * local_100)),
                             ZEXT416((uint)local_148.m_floats[0]),ZEXT416((uint)local_f4));
    auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)local_148.m_floats[2]),ZEXT416((uint)local_10c));
    acVar7 = (cbtScalar  [4])vinsertps_avx(auVar8,auVar5,0x28);
    local_50.m_floats = acVar7;
    (*(this->m_convexB->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])
              (this->m_convexB,&local_50);
    cVar1.m_floats = local_148.m_floats;
    auVar8 = vmovshdup_avx((undefined1  [16])acVar7);
    fVar6 = auVar8._0_4_;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * local_f0)),(undefined1  [16])acVar7,
                             ZEXT416((uint)local_ec));
    auVar8 = vfmadd231ss_fma(auVar8,auVar5,ZEXT416((uint)local_f4));
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * local_fc)),(undefined1  [16])acVar7,
                              ZEXT416((uint)local_f8));
    auVar10 = vfmadd231ss_fma(auVar10,auVar5,ZEXT416((uint)local_100));
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * local_108)),(undefined1  [16])acVar7,
                              ZEXT416((uint)local_104));
    auVar5 = vfmadd231ss_fma(auVar11,auVar5,ZEXT416((uint)local_10c));
    auVar8 = vinsertps_avx(ZEXT416((uint)(auVar8._0_4_ + local_120)),
                           ZEXT416((uint)(auVar10._0_4_ + local_124)),0x10);
    local_98.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar8,ZEXT416((uint)(auVar5._0_4_ + local_128)),0x28);
    auVar8 = vinsertps_avx(ZEXT416((uint)(local_88.m_floats[0] - local_98.m_floats[0])),
                           ZEXT416((uint)(local_88.m_floats[1] - local_98.m_floats[1])),0x10);
    local_a8.m_floats =
         (cbtScalar  [4])
         vmovlhps_avx(auVar8,ZEXT416((uint)(local_88.m_floats[2] - local_98.m_floats[2])));
    if (local_14c <= 1.0) {
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_148.m_floats[1] * local_a8.m_floats[1])),
                               ZEXT416((uint)local_148.m_floats[0]),
                               ZEXT416((uint)local_a8.m_floats[0]));
      auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_148.m_floats[2]),
                               ZEXT416((uint)local_a8.m_floats[2]));
      if (0.0 < auVar8._0_4_) {
        auVar5 = vfmadd132ss_fma(ZEXT416((uint)local_148.m_floats[0]),
                                 ZEXT416((uint)(local_148.m_floats[1] * local_134)),
                                 ZEXT416((uint)local_12c));
        auVar5 = vfmadd132ss_fma(ZEXT416((uint)local_148.m_floats[2]),auVar5,
                                 ZEXT416((uint)local_130));
        if (-1.4210855e-14 <= auVar5._0_4_) goto LAB_00905a07;
        local_14c = local_14c - auVar8._0_4_ / auVar5._0_4_;
        fVar6 = 1.0 - local_14c;
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_14c * (local_60->m_origin).m_floats[0])),
                                 ZEXT416((uint)fVar6),ZEXT416((uint)(fromA->m_origin).m_floats[0]));
        local_114 = auVar8._0_4_;
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_14c * (local_60->m_origin).m_floats[1])),
                                 ZEXT416((uint)fVar6),ZEXT416((uint)(fromA->m_origin).m_floats[1]));
        local_118 = auVar8._0_4_;
        auVar5 = ZEXT416((uint)fVar6);
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_14c * (local_60->m_origin).m_floats[2])),
                                 auVar5,ZEXT416((uint)(fromA->m_origin).m_floats[2]));
        local_11c = auVar8._0_4_;
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_14c * (local_58->m_origin).m_floats[0])),
                                 auVar5,ZEXT416((uint)(fromB->m_origin).m_floats[0]));
        local_120 = auVar8._0_4_;
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_14c * (local_58->m_origin).m_floats[1])),
                                 auVar5,ZEXT416((uint)(fromB->m_origin).m_floats[1]));
        local_124 = auVar8._0_4_;
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_14c * (local_58->m_origin).m_floats[2])),
                                 auVar5,ZEXT416((uint)(fromB->m_origin).m_floats[2]));
        local_128 = auVar8._0_4_;
        local_c8._8_8_ = 0;
        local_c8._0_4_ = local_148.m_floats[0];
        local_c8._4_4_ = local_148.m_floats[1];
        local_148.m_floats._8_8_ = cVar1.m_floats._8_8_;
        local_b8._8_8_ = 0;
        local_b8._0_4_ = local_148.m_floats[2];
        local_b8._4_4_ = local_148.m_floats[3];
      }
      local_148.m_floats = cVar1.m_floats;
      bVar2 = cbtVoronoiSimplexSolver::inSimplex(this->m_simplexSolver,&local_a8);
      if (!bVar2) {
        cbtVoronoiSimplexSolver::addVertex(this->m_simplexSolver,&local_a8,&local_88,&local_98);
      }
      bVar3 = cbtVoronoiSimplexSolver::closest(this->m_simplexSolver,&local_148);
      auVar8 = ZEXT816(0) << 0x40;
      bVar2 = true;
      if (bVar3) {
        auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_148.m_floats[1] * local_148.m_floats[1])),
                                 ZEXT416((uint)local_148.m_floats[0]),
                                 ZEXT416((uint)local_148.m_floats[0]));
        auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_148.m_floats[2]),
                                 ZEXT416((uint)local_148.m_floats[2]),auVar8);
      }
      auVar9 = ZEXT1664(auVar8);
    }
    else {
LAB_00905a07:
      bVar2 = false;
      auVar9 = ZEXT464((uint)local_110);
    }
    if (!bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool cbtSubsimplexConvexCast::calcTimeOfImpact(
	const cbtTransform& fromA,
	const cbtTransform& toA,
	const cbtTransform& fromB,
	const cbtTransform& toB,
	CastResult& result)
{
	m_simplexSolver->reset();

	cbtVector3 linVelA, linVelB;
	linVelA = toA.getOrigin() - fromA.getOrigin();
	linVelB = toB.getOrigin() - fromB.getOrigin();

	cbtScalar lambda = cbtScalar(0.);

	cbtTransform interpolatedTransA = fromA;
	cbtTransform interpolatedTransB = fromB;

	///take relative motion
	cbtVector3 r = (linVelA - linVelB);
	cbtVector3 v;

	cbtVector3 supVertexA = fromA(m_convexA->localGetSupportingVertex(-r * fromA.getBasis()));
	cbtVector3 supVertexB = fromB(m_convexB->localGetSupportingVertex(r * fromB.getBasis()));
	v = supVertexA - supVertexB;
	int maxIter = result.m_subSimplexCastMaxIterations;

	cbtVector3 n;
	n.setValue(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));

	cbtVector3 c;

	cbtScalar dist2 = v.length2();



	cbtVector3 w, p;
	cbtScalar VdotR;

	while ((dist2 > result.m_subSimplexCastEpsilon) && maxIter--)
	{
		supVertexA = interpolatedTransA(m_convexA->localGetSupportingVertex(-v * interpolatedTransA.getBasis()));
		supVertexB = interpolatedTransB(m_convexB->localGetSupportingVertex(v * interpolatedTransB.getBasis()));
		w = supVertexA - supVertexB;

		cbtScalar VdotW = v.dot(w);

		if (lambda > cbtScalar(1.0))
		{
			return false;
		}

		if (VdotW > cbtScalar(0.))
		{
			VdotR = v.dot(r);

			if (VdotR >= -(SIMD_EPSILON * SIMD_EPSILON))
				return false;
			else
			{
				lambda = lambda - VdotW / VdotR;
				//interpolate to next lambda
				//	x = s + lambda * r;
				interpolatedTransA.getOrigin().setInterpolate3(fromA.getOrigin(), toA.getOrigin(), lambda);
				interpolatedTransB.getOrigin().setInterpolate3(fromB.getOrigin(), toB.getOrigin(), lambda);
				//m_simplexSolver->reset();
				//check next line
				w = supVertexA - supVertexB;

				n = v;
			}
		}
		///Just like regular GJK only add the vertex if it isn't already (close) to current vertex, it would lead to divisions by zero and NaN etc.
		if (!m_simplexSolver->inSimplex(w))
			m_simplexSolver->addVertex(w, supVertexA, supVertexB);

		if (m_simplexSolver->closest(v))
		{
			dist2 = v.length2();

			//todo: check this normal for validity
			//n=v;
			//printf("V=%f , %f, %f\n",v[0],v[1],v[2]);
			//printf("DIST2=%f\n",dist2);
			//printf("numverts = %i\n",m_simplexSolver->numVertices());
		}
		else
		{
			dist2 = cbtScalar(0.);
		}
	}

	//int numiter = MAX_ITERATIONS - maxIter;
	//	printf("number of iterations: %d", numiter);

	//don't report a time of impact when moving 'away' from the hitnormal

	result.m_fraction = lambda;
	if (n.length2() >= (SIMD_EPSILON * SIMD_EPSILON))
		result.m_normal = n.normalized();
	else
		result.m_normal = cbtVector3(cbtScalar(0.0), cbtScalar(0.0), cbtScalar(0.0));

	//don't report time of impact for motion away from the contact normal (or causes minor penetration)
	if (result.m_normal.dot(r) >= -result.m_allowedPenetration)
		return false;

	cbtVector3 hitA, hitB;
	m_simplexSolver->compute_points(hitA, hitB);
	result.m_hitPoint = hitB;
	return true;
}